

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

uint32 __thiscall
Js::IndexPropertyDescriptorMap::DeleteDownTo(IndexPropertyDescriptorMap *this,uint32 firstKey)

{
  uint key;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  IndexPropertyDescriptor *in_RAX;
  undefined4 *puVar4;
  uint uVar5;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  
  local_38 = in_RAX;
  EnsureIndexList(this);
  pBVar1 = (this->indexPropertyMap).ptr;
  uVar5 = pBVar1->freeCount;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar5 = ~uVar5 + pBVar1->count;
  while( true ) {
    if ((int)uVar5 < 0) {
      return firstKey;
    }
    key = (this->indexList).ptr[uVar5];
    if (key < firstKey) break;
    bVar3 = TryGetReference(this,key,&local_38);
    if (!bVar3 || local_38 == (IndexPropertyDescriptor *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0xbe,"(b && descriptor)","b && descriptor");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    if ((local_38->Attributes & 8) == 0) {
      if ((local_38->Attributes & 2) == 0) {
        return key + 1;
      }
      (local_38->Getter).ptr = (void *)0x0;
      (local_38->Setter).ptr = (void *)0x0;
      local_38->Attributes = '\x0e';
    }
    uVar5 = uVar5 - 1;
  }
  return firstKey;
}

Assistant:

uint32 IndexPropertyDescriptorMap::DeleteDownTo(uint32 firstKey)
    {
        EnsureIndexList();

        // Iterate the index list backwards to delete from right to left
        for (int i = Count() - 1; i >= 0; i--)
        {
            uint32 key = indexList[i];
            if (key < firstKey)
            {
                break; // We are done, [firstKey, ...) have already been deleted
            }

            IndexPropertyDescriptor* descriptor;
            bool b = TryGetReference(key, &descriptor);
            Assert(b && descriptor);

            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip empty entry
            }

            if (descriptor->Attributes & PropertyConfigurable)
            {
                descriptor->Getter = nullptr;
                descriptor->Setter = nullptr;
                descriptor->Attributes = PropertyDeleted | PropertyWritable | PropertyConfigurable;
            }
            else
            {
                // Cannot delete key, and [key + 1, ...) are all deleted
                return key + 1;
            }
        }

        return firstKey;
    }